

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

void __thiscall rr::Renderer::drawInstanced(Renderer *this,DrawCommand *command,int numInstances)

{
  VertexPacket **ppVVar1;
  undefined8 *puVar2;
  long lVar3;
  IndexType IVar4;
  ProvokingVertex PVar5;
  GeometryShaderOutputType GVar6;
  VertexShader *pVVar7;
  GeometryShader *pGVar8;
  pointer pVVar9;
  pointer pVVar10;
  pointer pVVar11;
  RenderState *pRVar12;
  void *pvVar13;
  undefined4 *puVar14;
  VertexPacket *pVVar15;
  int iVar16;
  VertexPacket *pVVar17;
  pointer pLVar18;
  RenderTarget *state;
  TextureChannelClass TVar19;
  PrimitiveType PVar20;
  uint uVar21;
  iterator it_2;
  Program *pPVar22;
  size_t sVar23;
  TriangleAdjacency *pTVar24;
  TriangleAdjacency *pTVar25;
  size_t ndx_1;
  VertexPacket *pVVar26;
  size_type sVar27;
  pointer ppVVar28;
  pointer pVVar29;
  pointer pFVar30;
  ulong uVar31;
  pointer pVVar32;
  GenericVecType GVar33;
  pointer pVVar34;
  RenderTarget *pRVar35;
  ulong uVar36;
  ulong uVar37;
  FragmentShader *pFVar38;
  pointer pFVar39;
  PrimitiveList *this_00;
  TriangleAdjacency *pTVar40;
  pointer ppVVar41;
  pointer pVVar42;
  ulong uVar43;
  VertexPacketAllocator *pVVar44;
  pointer pVVar45;
  ulong uVar46;
  long lVar47;
  int invocationNdx;
  uint uVar48;
  iterator it;
  long lVar49;
  ulong uVar50;
  pointer pVVar51;
  ulong elementNdx;
  vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> inputPrimitives;
  vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> primitives;
  VertexPacketAllocator vpalloc_1;
  GeometryEmitter emitter;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> vertexPackets;
  VertexPacketAllocator vpalloc;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> local_168;
  ulong local_150;
  RenderTarget *local_148;
  uint local_13c;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> local_138;
  vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> local_118;
  VertexPacketAllocator *local_100;
  VertexPacketAllocator local_f8;
  GeometryEmitter local_c0;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> local_90;
  ulong local_78;
  uint local_6c;
  VertexPacketAllocator local_68;
  
  if (numInstances < 1) {
    return;
  }
  pPVar22 = command->program;
  pVVar7 = pPVar22->vertexShader;
  pGVar8 = pPVar22->geometryShader;
  if (pGVar8 == (GeometryShader *)0x0) {
    pFVar38 = pPVar22->fragmentShader;
    pVVar29 = (pVVar7->m_outputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar34 = (pVVar7->m_outputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar42 = (pFVar38->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar45 = (pFVar38->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pVVar34 - (long)pVVar29 != (long)pVVar45 - (long)pVVar42) {
      return;
    }
    if (pVVar29 != pVVar34) {
      lVar49 = 0;
      do {
        if (*(int *)((long)&pVVar29->type + lVar49) != *(int *)((long)&pVVar42->type + lVar49)) {
          return;
        }
        if ((&pVVar29->flatshade)[lVar49] != (&pVVar42->flatshade)[lVar49]) {
          return;
        }
        pVVar32 = (pointer)((long)&pVVar29[1].type + lVar49);
        lVar49 = lVar49 + 8;
      } while (pVVar32 != pVVar34);
    }
  }
  else {
    pVVar29 = (pVVar7->m_outputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar34 = (pVVar7->m_outputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar42 = (pGVar8->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((long)pVVar34 - (long)pVVar29 !=
        (long)(pGVar8->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pVVar42) {
      return;
    }
    if (pVVar29 != pVVar34) {
      lVar49 = 0;
      do {
        if (*(int *)((long)&pVVar29->type + lVar49) != *(int *)((long)&pVVar42->type + lVar49)) {
          return;
        }
        if ((&pVVar29->flatshade)[lVar49] != (&pVVar42->flatshade)[lVar49]) {
          return;
        }
        pVVar45 = (pointer)((long)&pVVar29[1].type + lVar49);
        lVar49 = lVar49 + 8;
      } while (pVVar45 != pVVar34);
    }
    pFVar38 = pPVar22->fragmentShader;
    pVVar32 = (pGVar8->m_outputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar9 = (pGVar8->m_outputs).
             super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar42 = (pFVar38->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar45 = (pFVar38->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pVVar9 - (long)pVVar32 != (long)pVVar45 - (long)pVVar42) {
      return;
    }
    if (pVVar32 != pVVar9) {
      lVar49 = 0;
      do {
        if (*(int *)((long)&pVVar32->type + lVar49) != *(int *)((long)&pVVar42->type + lVar49)) {
          return;
        }
        if ((&pVVar32->flatshade)[lVar49] != (&pVVar42->flatshade)[lVar49]) {
          return;
        }
        pVVar51 = (pointer)((long)&pVVar32[1].type + lVar49);
        lVar49 = lVar49 + 8;
      } while (pVVar51 != pVVar9);
    }
  }
  pVVar10 = (pVVar7->m_inputs).
            super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar11 = (pVVar7->m_inputs).
            super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar46 = (long)pVVar11 - (long)pVVar10 >> 2;
  if (pVVar11 != pVVar10) {
    lVar49 = 0;
    do {
      if (GENERICVECTYPE_INT32 < pVVar10[lVar49].type) {
        return;
      }
      lVar49 = lVar49 + 1;
    } while (uVar46 + (uVar46 == 0) != lVar49);
  }
  if ((long)pVVar34 - (long)pVVar29 != 0) {
    lVar49 = (long)pVVar34 - (long)pVVar29 >> 3;
    lVar47 = 0;
    do {
      if (GENERICVECTYPE_INT32 < pVVar29[lVar47].type) {
        return;
      }
      lVar47 = lVar47 + 1;
    } while (lVar49 + (ulong)(lVar49 == 0) != lVar47);
  }
  if ((long)pVVar45 - (long)pVVar42 != 0) {
    lVar47 = (long)pVVar45 - (long)pVVar42 >> 3;
    lVar49 = 0;
    do {
      if (GENERICVECTYPE_INT32 < pVVar42[lVar49].type) {
        return;
      }
      lVar49 = lVar49 + 1;
    } while (lVar47 + (ulong)(lVar47 == 0) != lVar49);
  }
  pFVar30 = (pFVar38->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar39 = (pFVar38->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar43 = (long)pFVar39 - (long)pFVar30 >> 2;
  if (pFVar39 != pFVar30) {
    lVar49 = 0;
    do {
      if (GENERICVECTYPE_INT32 < pFVar30[lVar49].type) {
        return;
      }
      lVar49 = lVar49 + 1;
    } while (uVar43 + (uVar43 == 0) != lVar49);
  }
  if (pGVar8 != (GeometryShader *)0x0) {
    pVVar29 = (pGVar8->m_inputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar49 = (long)(pGVar8->m_inputs).
                   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar29;
    if (lVar49 != 0) {
      lVar49 = lVar49 >> 3;
      lVar47 = 0;
      do {
        if (GENERICVECTYPE_INT32 < pVVar29[lVar47].type) {
          return;
        }
        lVar47 = lVar47 + 1;
      } while (lVar49 + (ulong)(lVar49 == 0) != lVar47);
    }
    pVVar29 = (pGVar8->m_outputs).
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar49 = (long)(pGVar8->m_outputs).
                   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar29;
    if (lVar49 != 0) {
      lVar49 = lVar49 >> 3;
      lVar47 = 0;
      do {
        if (GENERICVECTYPE_INT32 < pVVar29[lVar47].type) {
          return;
        }
        lVar47 = lVar47 + 1;
      } while (lVar49 + (ulong)(lVar49 == 0) != lVar47);
    }
  }
  if ((ulong)(long)command->numVertexAttribs < uVar46) {
    return;
  }
  pRVar35 = command->renderTarget;
  if ((ulong)(long)pRVar35->m_numColorBuffers < uVar43) {
    return;
  }
  local_100 = (VertexPacketAllocator *)command;
  local_6c = numInstances;
  if (0 < pRVar35->m_numColorBuffers) {
    lVar49 = 0;
    do {
      MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                ((MultisampleConstPixelBufferAccess *)&local_f8,
                 (MultisamplePixelBufferAccess *)pRVar35);
      local_c0.m_emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                ((MultisampleConstPixelBufferAccess *)&local_68,
                 (MultisamplePixelBufferAccess *)
                 (&((RenderTarget *)
                   (local_100->m_allocations).
                   super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->field_0x0 + lVar49 * 0x28));
      local_118.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_68.m_allocations.
                    super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                    super__Vector_impl_data._4_8_;
      uVar46 = 0xffffffffffffffff;
      do {
        if (uVar46 == 2) goto LAB_00593460;
        lVar3 = uVar46 * 4;
        uVar43 = uVar46 + 1;
        lVar47 = uVar46 * 4;
        uVar46 = uVar43;
      } while (*(int *)((long)&local_c0.m_emitted.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar3) ==
               *(int *)((long)&local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar47));
      if (uVar43 < 3) {
        return;
      }
LAB_00593460:
      pRVar35 = (RenderTarget *)
                (local_100->m_allocations).
                super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)&pRVar35->field_0x8 != *(int *)(&pRVar35->field_0x8 + lVar49 * 0x28)) {
        return;
      }
      lVar49 = lVar49 + 1;
    } while (lVar49 < pRVar35->m_numColorBuffers);
    pPVar22 = (Program *)
              (local_100->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pFVar30 = (pPVar22->fragmentShader->m_outputs).
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar39 = (pPVar22->fragmentShader->m_outputs).
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  pVVar44 = local_100;
  if (pFVar39 != pFVar30) {
    lVar49 = 0;
    uVar46 = 0;
    do {
      TVar19 = tcu::getTextureChannelClass
                         (*(ChannelType *)
                           (&((RenderTarget *)
                             (pVVar44->m_allocations).
                             super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                             _M_impl.super__Vector_impl_data._M_start)->field_0x4 +
                           (lVar49 >> 0x20) * 0x28));
      GVar33 = (GenericVecType)(TVar19 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
      if (TVar19 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        GVar33 = GENERICVECTYPE_INT32;
      }
      pPVar22 = (Program *)
                (pVVar44->m_allocations).
                super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pFVar30 = (pPVar22->fragmentShader->m_outputs).
                super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pFVar30[uVar46].type != GVar33) {
        return;
      }
      uVar46 = uVar46 + 1;
      lVar49 = lVar49 + 0x100000000;
    } while (uVar46 < (ulong)((long)(pPVar22->fragmentShader->m_outputs).
                                    super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar30 >> 2)
            );
  }
  pVVar29 = (pPVar22->vertexShader->m_outputs).
            super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar49 = (long)(pPVar22->vertexShader->m_outputs).
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pVVar29;
  sVar23 = lVar49 >> 3;
  if (lVar49 != 0) {
    lVar49 = 0;
    do {
      if ((pVVar29[lVar49].flatshade == false) && (pVVar29[lVar49].type - GENERICVECTYPE_UINT32 < 2)
         ) {
        return;
      }
      lVar49 = lVar49 + 1;
    } while (sVar23 + (sVar23 == 0) != lVar49);
  }
  pGVar8 = pPVar22->geometryShader;
  if (pGVar8 == (GeometryShader *)0x0) goto switchD_005935ad_default;
  pVVar29 = (pGVar8->m_outputs).
            super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar49 = (long)(pGVar8->m_outputs).
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pVVar29;
  if (lVar49 != 0) {
    lVar49 = lVar49 >> 3;
    lVar47 = 0;
    do {
      if ((pVVar29[lVar47].flatshade == false) && (pVVar29[lVar47].type - GENERICVECTYPE_UINT32 < 2)
         ) {
        return;
      }
      lVar47 = lVar47 + 1;
    } while (lVar49 + (ulong)(lVar49 == 0) != lVar47);
  }
  switch(pGVar8->m_inputType) {
  case GEOMETRYSHADERINPUTTYPE_POINTS:
    if (((PrimitiveList *)
        (local_100->m_singleAllocPool).
        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
        super__Vector_impl_data._M_finish)->m_primitiveType != PRIMITIVETYPE_POINTS) {
      return;
    }
    goto switchD_005935ad_default;
  case GEOMETRYSHADERINPUTTYPE_LINES:
    PVar20 = ((PrimitiveList *)
             (local_100->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType - PRIMITIVETYPE_LINES;
    break;
  case GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY:
    uVar21 = ((PrimitiveList *)
             (local_100->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType - PRIMITIVETYPE_LINES_ADJACENCY;
    goto joined_r0x005935d3;
  case GEOMETRYSHADERINPUTTYPE_TRIANGLES:
    PVar20 = ((PrimitiveList *)
             (local_100->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType;
    break;
  case GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY:
    uVar21 = ((PrimitiveList *)
             (local_100->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType - PRIMITIVETYPE_TRIANGLES_ADJACENCY
    ;
joined_r0x005935d3:
    if (1 < uVar21) {
      return;
    }
  default:
    goto switchD_005935ad_default;
  }
  if (PRIMITIVETYPE_TRIANGLE_FAN < PVar20) {
    return;
  }
switchD_005935ad_default:
  if (((PrimitiveList *)
      (local_100->m_singleAllocPool).
      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->m_numElements != 0) {
    VertexPacketAllocator::VertexPacketAllocator(&local_68,sVar23);
    pVVar44 = local_100;
    VertexPacketAllocator::allocArray
              (&local_90,&local_68,
               ((PrimitiveList *)
               (local_100->m_singleAllocPool).
               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
               super__Vector_impl_data._M_finish)->m_numElements);
    this_00 = (PrimitiveList *)
              (pVVar44->m_singleAllocPool).
              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_78 = 0;
    do {
      uVar46 = this_00->m_numElements;
      if (uVar46 != 0) {
        elementNdx = 0;
        uVar43 = 0;
        do {
          ppVVar41 = local_90.
                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (elementNdx < uVar46) {
            uVar46 = 0;
            local_150 = uVar43;
            do {
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              if ((pRVar12->restart).enabled == true) {
                uVar21 = (pRVar12->restart).restartIndex;
                pvVar13 = this_00->m_indices;
                if (pvVar13 == (void *)0x0) {
                  if (elementNdx == uVar21) break;
                }
                else {
                  IVar4 = this_00->m_indexType;
                  if (IVar4 == INDEXTYPE_UINT32) {
                    uVar48 = *(uint *)((long)pvVar13 + elementNdx * 4);
                  }
                  else if (IVar4 == INDEXTYPE_UINT16) {
                    uVar48 = (uint)*(ushort *)((long)pvVar13 + elementNdx * 2);
                  }
                  else {
                    uVar48 = 0;
                    if (IVar4 == INDEXTYPE_UINT8) {
                      uVar48 = (uint)*(byte *)((long)pvVar13 + elementNdx);
                    }
                  }
                  if (uVar48 == uVar21) break;
                }
              }
              puVar14 = *(undefined4 **)((undefined1 *)ppVVar41 + (long)(int)uVar46 * 8);
              *puVar14 = (int)local_78;
              sVar23 = PrimitiveList::getIndex(this_00,elementNdx);
              puVar14[1] = (int)sVar23;
              puVar14[6] = (pRVar12->point).pointSize;
              uVar46 = (ulong)((int)uVar46 + 1);
              elementNdx = elementNdx + 1;
              *(undefined8 *)(puVar14 + 2) = 0;
              *(undefined8 *)(puVar14 + 4) = 0;
              this_00 = (PrimitiveList *)
                        (local_100->m_singleAllocPool).
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pVVar44 = local_100;
            } while (elementNdx < this_00->m_numElements);
            uVar21 = (uint)uVar46;
            if (uVar21 == 0) {
switchD_00593783_default:
              uVar43 = local_150 & 0xffffffff;
              goto LAB_00595cde;
            }
            pVVar7 = ((Program *)
                     (pVVar44->m_allocations).
                     super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish)->vertexShader;
            (**pVVar7->_vptr_VertexShader)
                      (pVVar7,(VertexAttrib *)
                              (pVVar44->m_singleAllocPool).
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                       local_90.
                       super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,uVar46);
            ppVVar41 = local_90.
                       super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            switch(((PrimitiveList *)
                   (pVVar44->m_singleAllocPool).
                   super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->m_primitiveType) {
            case PRIMITIVETYPE_TRIANGLES:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              local_148 = (RenderTarget *)
                          (pVVar44->m_allocations).
                          super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_168,
                         (ulong)(long)(int)uVar21 / 3,(allocator_type *)&local_f8);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              PVar5 = pRVar12->provokingVertexConvention;
              if (2 < uVar21) {
                uVar46 = 2;
                pTVar24 = (TriangleAdjacency *)
                          local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  pVVar26 = *(VertexPacket **)((undefined1 *)ppVVar41 + uVar46 * 8);
                  puVar2 = (undefined8 *)((long)ppVVar41 + uVar46 * 8 + -0x10);
                  pVVar15 = (VertexPacket *)puVar2[1];
                  pTVar24->v0 = (VertexPacket *)*puVar2;
                  pTVar24->v1 = pVVar15;
                  pTVar24->v2 = pVVar26;
                  *(uint *)&pTVar24->v3 = (uint)(PVar5 != PROVOKINGVERTEX_FIRST) * 2;
                  uVar46 = uVar46 + 3;
                  pTVar24 = (TriangleAdjacency *)&pTVar24->v4;
                } while (uVar46 < (ulong)(long)(int)uVar21);
              }
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 == (GeometryShader *)0x0) {
                local_f8.m_numberOfVertexOutputs =
                     (size_t)local_168.
                             super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl
                             .super__Vector_impl_data._M_start;
                local_f8.m_allocations.
                super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish,0);
                local_f8.m_allocations.
                super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)
                     ((ulong)local_168.
                             super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl
                             .super__Vector_impl_data._M_finish >> 0x20);
                local_f8.m_allocations.
                super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ =
                     SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                local_f8.m_allocations.
                super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_ =
                     (undefined4)
                     ((ulong)local_168.
                             super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage >> 0x20);
                local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (anonymous_namespace)::
                makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                          ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                           &local_68);
                uVar46 = local_150;
                if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                  uVar21 = (uint)local_150;
                }
                else {
                  do {
                    iVar16 = (int)uVar46;
                    uVar21 = iVar16 + 1;
                    pTVar25->v0->primitiveID = iVar16;
                    pTVar25->v1->primitiveID = iVar16;
                    pTVar25->v2->primitiveID = iVar16;
                    pTVar25 = (TriangleAdjacency *)&pTVar25->v4;
                    uVar46 = (ulong)uVar21;
                  } while (pTVar25 != (TriangleAdjacency *)pLVar18);
                }
                uVar43 = (ulong)uVar21;
                (anonymous_namespace)::
                drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                          (pRVar12,local_148,pPVar22,
                           (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                           &local_68);
                break;
              }
              VertexPacketAllocator::VertexPacketAllocator
                        (&local_f8,
                         (long)(pGVar8->m_outputs).
                               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pGVar8->m_outputs).
                               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3);
              GeometryEmitter::GeometryEmitter
                        (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
              uVar43 = local_150;
              std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                        (&local_118,
                         (long)local_168.
                               super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_168.
                               super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 5,
                         (allocator_type *)&local_138);
              local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
              if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lVar49 = 0x10;
                lVar47 = 0x18;
                uVar46 = 0;
                do {
                  *(int *)((long)(local_118.
                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->vertices +
                          lVar47 + -0x20) = (int)uVar43 + (int)uVar46;
                  *(undefined8 *)
                   ((long)(local_118.
                           super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                           ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x18) =
                       *(undefined8 *)
                        ((long)local_168.
                               super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                  *(undefined8 *)
                   ((long)(local_118.
                           super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                           ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10) =
                       *(undefined8 *)
                        ((long)local_168.
                               super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                  *(undefined8 *)
                   ((long)(local_118.
                           super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                           ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                       *(undefined8 *)
                        ((long)&(local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                  uVar46 = uVar46 + 1;
                  lVar49 = lVar49 + 0x20;
                  lVar47 = lVar47 + 0x38;
                } while (uVar46 < (ulong)((long)local_168.
                                                super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_168.
                                                super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
                uVar43 = (ulong)(uint)((int)uVar43 + (int)uVar46);
              }
              if ((local_118.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
                   local_118.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                uVar21 = (uint)uVar43;
                uVar46 = 0;
                do {
                  (**pPVar22->geometryShader->_vptr_GeometryShader)
                            (pPVar22->geometryShader,&local_c0,3,
                             local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                              
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                          -0x49249249),uVar46);
                  local_138.
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_138.
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_138.
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                  ppVVar41 = local_138.
                             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  if ((long)local_138.
                            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.
                            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                            ._M_impl.super__Vector_impl_data._M_start != 0) {
                    uVar37 = (long)local_138.
                                   super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_138.
                                   super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3;
                    uVar43 = 0;
                    ppVVar28 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    do {
                      uVar31 = uVar43 + 1;
                      if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                        if (uVar31 < uVar37) {
                          uVar31 = uVar37;
                        }
                        ppVVar1 = ppVVar41 + uVar43;
                        uVar37 = uVar43;
                        do {
                          uVar36 = uVar37;
                          uVar37 = uVar31;
                          uVar50 = uVar31 - 1;
                          if (uVar31 - 1 == uVar36) break;
                          uVar37 = uVar36 + 1;
                          uVar50 = uVar36;
                        } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                        GVar6 = pPVar22->geometryShader->m_outputType;
                        if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                          anon_unknown_19::
                          drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                    (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                        }
                        else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                          anon_unknown_19::
                          drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                    (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                        }
                        else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                          anon_unknown_19::
                          drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                    (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                        }
                        ppVVar28 = local_138.
                                   super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        uVar31 = uVar50 + 2;
                        ppVVar41 = local_138.
                                   super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                      }
                      uVar43 = uVar31;
                      uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                    } while (uVar43 < uVar37);
                  }
                  if (ppVVar41 != (pointer)0x0) {
                    operator_delete(ppVVar41,(long)local_138.
                                                                                                      
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             - (long)ppVVar41);
                  }
                  uVar48 = (int)uVar46 + 1;
                  uVar46 = (ulong)uVar48;
                } while (uVar48 != local_13c);
LAB_00594cc7:
                uVar43 = (ulong)uVar21;
              }
LAB_00595af5:
              if (local_118.
                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.
                                      super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.
                                      super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_c0.m_emitted.
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.m_emitted.
                                super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_c0.m_emitted.
                                      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.m_emitted.
                                      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
LAB_00595b2c:
              VertexPacketAllocator::~VertexPacketAllocator(&local_f8);
              goto LAB_00595cc3;
            case PRIMITIVETYPE_TRIANGLE_STRIP:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              pRVar35 = (RenderTarget *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              local_148 = (RenderTarget *)
                          local_90.
                          super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              sVar27 = 0;
              if (2 < uVar21) {
                sVar27 = (long)(int)uVar21 - 2;
              }
              std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_168,
                         sVar27,(allocator_type *)&local_f8);
              pa::TriangleStrip::
              exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
                        ((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                          )local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start,(VertexPacket **)local_148,
                         (long)(int)uVar21,pRVar12->provokingVertexConvention);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           (long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 5,
                           (allocator_type *)&local_138);
                iVar16 = (int)pPVar22->geometryShader->m_numInvocations;
                local_148 = (RenderTarget *)CONCAT44(local_148._4_4_,iVar16);
                uVar21 = (uint)local_150;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 0x10;
                  lVar47 = 0x18;
                  uVar46 = 0;
                  do {
                    *(uint *)((long)(local_118.
                                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vertices +
                             lVar47 + -0x20) = (uint)local_150 + (int)uVar46;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x18)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 0x20;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar46 < (ulong)((long)local_168.
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_168.
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                  uVar21 = (uint)local_150 + (int)uVar46;
                }
                uVar43 = (ulong)uVar21;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < iVar16)) {
                  local_150 = CONCAT44(local_150._4_4_,uVar21);
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,3,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar21 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar21;
                  } while (uVar21 != (uint)local_148);
LAB_00595aeb:
                  uVar43 = local_150 & 0xffffffff;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs =
                   (size_t)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_finish,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              uVar46 = local_150;
              if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                uVar21 = (uint)local_150;
              }
              else {
                do {
                  iVar16 = (int)uVar46;
                  uVar21 = iVar16 + 1;
                  pTVar25->v0->primitiveID = iVar16;
                  pTVar25->v1->primitiveID = iVar16;
                  pTVar25->v2->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v4;
                  uVar46 = (ulong)uVar21;
                } while (pTVar25 != (TriangleAdjacency *)pLVar18);
              }
              uVar43 = (ulong)uVar21;
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        (pRVar12,pRVar35,pPVar22,
                         (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              break;
            case PRIMITIVETYPE_TRIANGLE_FAN:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              local_148 = (RenderTarget *)
                          (pVVar44->m_allocations).
                          super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              sVar27 = 0;
              if (2 < uVar21) {
                sVar27 = (long)(int)uVar21 - 2U;
              }
              std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_168,
                         sVar27,(allocator_type *)&local_f8);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              PVar5 = pRVar12->provokingVertexConvention;
              if (2 < uVar21) {
                pVVar26 = *ppVVar41;
                sVar27 = 0;
                pTVar24 = (TriangleAdjacency *)
                          local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  pVVar15 = *(VertexPacket **)((undefined1 *)((long)ppVVar41 + 8) + sVar27 * 8);
                  pVVar17 = *(VertexPacket **)
                             ((long)((undefined1 *)((long)ppVVar41 + 8) + sVar27 * 8) + 8);
                  pTVar24->v0 = pVVar26;
                  pTVar24->v1 = pVVar15;
                  pTVar24->v2 = pVVar17;
                  *(uint *)&pTVar24->v3 = 2 - (uint)(PVar5 == PROVOKINGVERTEX_FIRST);
                  sVar27 = sVar27 + 1;
                  pTVar24 = (TriangleAdjacency *)&pTVar24->v4;
                } while ((long)(int)uVar21 - 2U != sVar27);
              }
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                uVar43 = local_150;
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           (long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 5,
                           (allocator_type *)&local_138);
                local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 0x10;
                  lVar47 = 0x18;
                  uVar46 = 0;
                  do {
                    *(int *)((long)(local_118.
                                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vertices +
                            lVar47 + -0x20) = (int)uVar43 + (int)uVar46;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x18)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 0x20;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar46 < (ulong)((long)local_168.
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_168.
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                  uVar43 = (ulong)(uint)((int)uVar43 + (int)uVar46);
                }
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                  uVar21 = (uint)uVar43;
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,3,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar48 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar48;
                  } while (uVar48 != local_13c);
                  goto LAB_00594cc7;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs =
                   (size_t)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_finish,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              uVar46 = local_150;
              if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                uVar21 = (uint)local_150;
              }
              else {
                do {
                  iVar16 = (int)uVar46;
                  uVar21 = iVar16 + 1;
                  pTVar25->v0->primitiveID = iVar16;
                  pTVar25->v1->primitiveID = iVar16;
                  pTVar25->v2->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v4;
                  uVar46 = (ulong)uVar21;
                } while (pTVar25 != (TriangleAdjacency *)pLVar18);
              }
              uVar43 = (ulong)uVar21;
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        (pRVar12,local_148,pPVar22,
                         (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              break;
            case PRIMITIVETYPE_LINES:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              local_148 = (RenderTarget *)
                          (pVVar44->m_allocations).
                          super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
                        (&local_168,(ulong)(long)(int)uVar21 >> 1,(allocator_type *)&local_f8);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              PVar5 = pRVar12->provokingVertexConvention;
              if (uVar21 != 1) {
                uVar46 = 1;
                pTVar24 = (TriangleAdjacency *)
                          local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  puVar2 = (undefined8 *)((long)ppVVar41 + uVar46 * 8 + -8);
                  pVVar26 = (VertexPacket *)puVar2[1];
                  pTVar24->v0 = (VertexPacket *)*puVar2;
                  pTVar24->v1 = pVVar26;
                  *(uint *)&pTVar24->v2 = (uint)(PVar5 != PROVOKINGVERTEX_FIRST);
                  uVar46 = uVar46 + 2;
                  pTVar24 = (TriangleAdjacency *)&pTVar24->v3;
                } while (uVar46 < (ulong)(long)(int)uVar21);
              }
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                uVar46 = local_150;
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555,(allocator_type *)&local_138);
                local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 8;
                  lVar47 = 0x10;
                  uVar43 = 0;
                  do {
                    *(int *)((long)(local_118.
                                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vertices +
                            lVar47 + -0x18) = (int)uVar46 + (int)uVar43;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar43 = uVar43 + 1;
                    lVar49 = lVar49 + 0x18;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar43 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x5555555555555555));
                  uVar46 = (ulong)(uint)((int)uVar46 + (int)uVar43);
                }
                uVar43 = uVar46 & 0xffffffff;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                  uVar21 = (uint)uVar46;
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,2,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar48 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar48;
                  } while (uVar48 != local_13c);
                  goto LAB_00594cc7;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs =
                   (size_t)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_finish,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,&local_68)
              ;
              uVar46 = local_150;
              if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                uVar21 = (uint)local_150;
              }
              else {
                do {
                  iVar16 = (int)uVar46;
                  uVar21 = iVar16 + 1;
                  pVVar26 = pTVar25->v1;
                  pTVar25->v0->primitiveID = iVar16;
                  pVVar26->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v3;
                  uVar46 = (ulong)uVar21;
                } while (pTVar25 != (TriangleAdjacency *)pLVar18);
              }
              uVar43 = (ulong)uVar21;
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        (pRVar12,local_148,pPVar22,
                         (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,pVVar44);
              break;
            case PRIMITIVETYPE_LINE_STRIP:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              local_148 = (RenderTarget *)
                          (pVVar44->m_allocations).
                          super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
                        (&local_168,(long)(int)uVar21 - 1U,(allocator_type *)&local_f8);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (uVar21 != 1) {
                PVar5 = pRVar12->provokingVertexConvention;
                sVar27 = 0;
                pTVar24 = (TriangleAdjacency *)
                          local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  pVVar26 = *(VertexPacket **)((long)((undefined1 *)ppVVar41 + sVar27 * 8) + 8);
                  pTVar24->v0 = *(VertexPacket **)((undefined1 *)ppVVar41 + sVar27 * 8);
                  pTVar24->v1 = pVVar26;
                  *(uint *)&pTVar24->v2 = (uint)(PVar5 != PROVOKINGVERTEX_FIRST);
                  sVar27 = sVar27 + 1;
                  pTVar24 = (TriangleAdjacency *)&pTVar24->v3;
                } while ((long)(int)uVar21 - 1U != sVar27);
              }
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                uVar46 = local_150;
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555,(allocator_type *)&local_138);
                local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 8;
                  lVar47 = 0x10;
                  uVar43 = 0;
                  do {
                    *(int *)((long)(local_118.
                                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vertices +
                            lVar47 + -0x18) = (int)uVar46 + (int)uVar43;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar43 = uVar43 + 1;
                    lVar49 = lVar49 + 0x18;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar43 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x5555555555555555));
                  uVar46 = (ulong)(uint)((int)uVar46 + (int)uVar43);
                }
                uVar43 = uVar46 & 0xffffffff;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                  uVar21 = (uint)uVar46;
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,2,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar48 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar48;
                  } while (uVar48 != local_13c);
                  goto LAB_00594cc7;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs =
                   (size_t)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_finish,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,&local_68)
              ;
              uVar46 = local_150;
              if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                uVar21 = (uint)local_150;
              }
              else {
                do {
                  iVar16 = (int)uVar46;
                  uVar21 = iVar16 + 1;
                  pVVar26 = pTVar25->v1;
                  pTVar25->v0->primitiveID = iVar16;
                  pVVar26->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v3;
                  uVar46 = (ulong)uVar21;
                } while (pTVar25 != (TriangleAdjacency *)pLVar18);
              }
              uVar43 = (ulong)uVar21;
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        (pRVar12,local_148,pPVar22,
                         (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,pVVar44);
              break;
            case PRIMITIVETYPE_LINE_LOOP:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              local_148 = (RenderTarget *)
                          (pVVar44->m_allocations).
                          super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              sVar27 = 0;
              if (uVar21 != 1) {
                sVar27 = (long)(int)uVar21;
              }
              std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
                        (&local_168,sVar27,(allocator_type *)&local_f8);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (uVar21 != 1) {
                pVVar26 = *ppVVar41;
                PVar5 = pRVar12->provokingVertexConvention;
                sVar27 = 1;
                pTVar24 = (TriangleAdjacency *)
                          local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  pTVar40 = pTVar24;
                  pVVar15 = *(VertexPacket **)((undefined1 *)ppVVar41 + sVar27 * 8);
                  pTVar40->v0 = pVVar26;
                  pTVar40->v1 = pVVar15;
                  uVar48 = (uint)(PVar5 != PROVOKINGVERTEX_FIRST);
                  *(uint *)&pTVar40->v2 = uVar48;
                  pVVar26 = *(VertexPacket **)((undefined1 *)ppVVar41 + sVar27 * 8);
                  sVar27 = sVar27 + 1;
                  pTVar24 = (TriangleAdjacency *)&pTVar40->v3;
                } while ((long)(int)uVar21 != sVar27);
                pVVar15 = *ppVVar41;
                pTVar40->v3 = pVVar26;
                pTVar40->v4 = pVVar15;
                *(uint *)&pTVar40->v5 = uVar48;
              }
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555,(allocator_type *)&local_138);
                local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
                uVar21 = (uint)local_150;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 8;
                  lVar47 = 0x10;
                  uVar46 = 0;
                  do {
                    *(uint *)((long)(local_118.
                                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vertices +
                             lVar47 + -0x18) = (uint)local_150 + (int)uVar46;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 0x18;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar46 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x5555555555555555));
                  uVar21 = (uint)local_150 + (int)uVar46;
                }
                uVar43 = (ulong)uVar21;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                  local_150 = CONCAT44(local_150._4_4_,uVar21);
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,2,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar21 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar21;
                  } while (uVar21 != local_13c);
                  uVar43 = local_150 & 0xffffffff;
                }
                if (local_118.
                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_118.
                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_118.
                                        super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_118.
                                        super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_c0.m_emitted.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_c0.m_emitted.
                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_c0.m_emitted.
                                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_c0.m_emitted.
                                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_00595b2c;
              }
              local_f8.m_numberOfVertexOutputs =
                   (size_t)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_finish,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,&local_68)
              ;
              uVar46 = local_150;
              if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                uVar21 = (uint)local_150;
              }
              else {
                do {
                  iVar16 = (int)uVar46;
                  uVar21 = iVar16 + 1;
                  pVVar26 = pTVar25->v1;
                  pTVar25->v0->primitiveID = iVar16;
                  pVVar26->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v3;
                  uVar46 = (ulong)uVar21;
                } while (pTVar25 != (TriangleAdjacency *)pLVar18);
              }
              uVar43 = (ulong)uVar21;
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        (pRVar12,local_148,pPVar22,
                         (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,pVVar44);
              break;
            case PRIMITIVETYPE_POINTS:
              local_148 = (RenderTarget *)pVVar44->m_numberOfVertexOutputs;
              pRVar35 = (RenderTarget *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::vector
                        ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&local_168,
                         (long)(int)uVar21,(allocator_type *)&local_f8);
              pLVar18 = local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pTVar25 = (TriangleAdjacency *)
                        local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              sVar27 = 0;
              do {
                (&(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl
                   .super__Vector_impl_data._M_start)->v0)[sVar27] =
                     *(VertexPacket **)((undefined1 *)ppVVar41 + sVar27 * 8);
                sVar27 = sVar27 + 1;
              } while ((long)(int)uVar21 != sVar27);
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           (long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3,
                           (allocator_type *)&local_138);
                local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
                uVar21 = (uint)local_150;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 1;
                  uVar46 = 0;
                  do {
                    *(uint *)((local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -2) =
                         (uint)local_150 + (int)uVar46;
                    (local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices[lVar49 + -1] =
                         (&(local_168.
                            super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                            super__Vector_impl_data._M_start)->v0)[uVar46];
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 7;
                  } while (uVar46 < (ulong)((long)local_168.
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_168.
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                  uVar21 = (uint)local_150 + (int)uVar46;
                }
                uVar43 = (ulong)uVar21;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                  local_150 = CONCAT44(local_150._4_4_,uVar21);
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,1,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    state = local_148;
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      ((RenderState *)state,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,
                                       &local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      ((RenderState *)state,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,
                                       &local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      ((RenderState *)state,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,
                                       &local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar21 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar21;
                  } while (uVar21 != local_13c);
                  goto LAB_00595aeb;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs =
                   (size_t)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_finish,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   SUB84(local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)
                   ((ulong)local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
                        ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&local_f8,
                         &local_68);
              if (pTVar25 == (TriangleAdjacency *)pLVar18) {
                uVar21 = (uint)local_150;
              }
              else {
                uVar46 = local_150 & 0xffffffff;
                do {
                  pTVar25->v0->primitiveID = (int)uVar46;
                  uVar21 = (int)uVar46 + 1;
                  uVar46 = (ulong)uVar21;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v1;
                } while (pTVar25 != (TriangleAdjacency *)pLVar18);
              }
              uVar43 = (ulong)uVar21;
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
                        ((RenderState *)local_148,pRVar35,pPVar22,
                         (vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&local_f8,pVVar44)
              ;
              break;
            case PRIMITIVETYPE_LINES_ADJACENCY:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              pRVar35 = (RenderTarget *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::vector
                        ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                         &local_168,(ulong)(long)(int)uVar21 >> 2,(allocator_type *)&local_f8);
              pa::LinesAdjacency::
              exec<__gnu_cxx::__normal_iterator<rr::pa::LineAdjacency*,std::vector<rr::pa::LineAdjacency,std::allocator<rr::pa::LineAdjacency>>>>
                        ((__normal_iterator<rr::pa::LineAdjacency_*,_std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>_>
                          )local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start,ppVVar41,(long)(int)uVar21,
                         pRVar12->provokingVertexConvention);
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333,(allocator_type *)&local_138);
                iVar16 = (int)pPVar22->geometryShader->m_numInvocations;
                local_148 = (RenderTarget *)CONCAT44(local_148._4_4_,iVar16);
                uVar21 = (uint)local_150;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 0x18;
                  lVar47 = 0x20;
                  uVar46 = 0;
                  do {
                    *(uint *)((long)(local_118.
                                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vertices +
                             lVar47 + -0x28) = (uint)local_150 + (int)uVar46;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x20)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x18);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x18)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 0x28;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar46 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x3333333333333333));
                  uVar21 = (uint)local_150 + (int)uVar46;
                }
                uVar43 = (ulong)uVar21;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < iVar16)) {
                  local_150 = CONCAT44(local_150._4_4_,uVar21);
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,4,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar21 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar21;
                  } while (uVar21 != (uint)local_148);
                  goto LAB_00595aeb;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ = 0;
              anon_unknown_19::convertPrimitiveToBaseType
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,
                         (vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                         &local_168);
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,&local_68)
              ;
              pTVar25 = (TriangleAdjacency *)local_f8.m_numberOfVertexOutputs;
              uVar43 = local_150;
              if ((TriangleAdjacency *)local_f8.m_numberOfVertexOutputs ==
                  (TriangleAdjacency *)
                  CONCAT44(local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_)) {
                uVar43 = local_150 & 0xffffffff;
              }
              else {
                do {
                  iVar16 = (int)uVar43;
                  uVar43 = (ulong)(iVar16 + 1);
                  pVVar26 = pTVar25->v1;
                  pTVar25->v0->primitiveID = iVar16;
                  pVVar26->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v3;
                } while (pTVar25 !=
                         (TriangleAdjacency *)
                         CONCAT44(local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
              }
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        (pRVar12,pRVar35,pPVar22,
                         (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,pVVar44);
              break;
            case PRIMITIVETYPE_LINE_STRIP_ADJACENCY:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              local_148 = (RenderTarget *)
                          (pVVar44->m_allocations).
                          super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              sVar27 = 0;
              if (3 < uVar21) {
                sVar27 = (long)(int)uVar21 - 3U;
              }
              std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::vector
                        ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                         &local_168,sVar27,(allocator_type *)&local_f8);
              PVar5 = pRVar12->provokingVertexConvention;
              if (3 < uVar21) {
                sVar27 = 0;
                pTVar25 = (TriangleAdjacency *)
                          local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  lVar49 = sVar27 * 8;
                  pVVar26 = *(VertexPacket **)((long)((undefined1 *)ppVVar41 + lVar49) + 8);
                  pVVar15 = *(VertexPacket **)((undefined1 *)((long)ppVVar41 + 0x10) + sVar27 * 8);
                  pVVar17 = *(VertexPacket **)
                             ((long)((undefined1 *)((long)ppVVar41 + 0x10) + sVar27 * 8) + 8);
                  sVar27 = sVar27 + 1;
                  pTVar25->v0 = *(VertexPacket **)((undefined1 *)ppVVar41 + lVar49);
                  pTVar25->v1 = pVVar26;
                  pTVar25->v2 = pVVar15;
                  pTVar25->v3 = pVVar17;
                  *(uint *)&pTVar25->v4 = 2 - (uint)(PVar5 == PROVOKINGVERTEX_FIRST);
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v5;
                } while ((long)(int)uVar21 - 3U != sVar27);
              }
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                uVar46 = local_150;
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333,(allocator_type *)&local_138);
                local_13c = (uint)pPVar22->geometryShader->m_numInvocations;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 0x18;
                  lVar47 = 0x20;
                  uVar43 = 0;
                  do {
                    *(int *)((long)(local_118.
                                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vertices +
                            lVar47 + -0x28) = (int)uVar46 + (int)uVar43;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x20)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x18);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x18)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar47 + -8) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar43 = uVar43 + 1;
                    lVar49 = lVar49 + 0x28;
                    lVar47 = lVar47 + 0x38;
                  } while (uVar43 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x3333333333333333));
                  uVar46 = (ulong)(uint)((int)uVar46 + (int)uVar43);
                }
                uVar43 = uVar46 & 0xffffffff;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < (int)local_13c)) {
                  uVar21 = (uint)uVar46;
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,4,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,local_148,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar48 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar48;
                  } while (uVar48 != local_13c);
                  goto LAB_00594cc7;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ = 0;
              anon_unknown_19::convertPrimitiveToBaseType
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,
                         (vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                         &local_168);
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,&local_68)
              ;
              pTVar25 = (TriangleAdjacency *)local_f8.m_numberOfVertexOutputs;
              uVar43 = local_150;
              if ((TriangleAdjacency *)local_f8.m_numberOfVertexOutputs ==
                  (TriangleAdjacency *)
                  CONCAT44(local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_)) {
                uVar43 = local_150 & 0xffffffff;
              }
              else {
                do {
                  iVar16 = (int)uVar43;
                  uVar43 = (ulong)(iVar16 + 1);
                  pVVar26 = pTVar25->v1;
                  pTVar25->v0->primitiveID = iVar16;
                  pVVar26->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v3;
                } while (pTVar25 !=
                         (TriangleAdjacency *)
                         CONCAT44(local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
              }
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                        (pRVar12,local_148,pPVar22,
                         (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&local_f8,pVVar44);
              break;
            case PRIMITIVETYPE_TRIANGLES_ADJACENCY:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              pRVar35 = (RenderTarget *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
              vector((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                      *)&local_168,(ulong)(long)(int)uVar21 / 6,(allocator_type *)&local_f8);
              pa::TrianglesAdjacency::
              exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
                        ((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                          )local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start,ppVVar41,(long)(int)uVar21,
                         pRVar12->provokingVertexConvention);
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x6db6db6db6db6db7,(allocator_type *)&local_138);
                iVar16 = (int)pPVar22->geometryShader->m_numInvocations;
                local_148 = (RenderTarget *)CONCAT44(local_148._4_4_,iVar16);
                uVar21 = (uint)local_150;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 0x28;
                  uVar46 = 0;
                  do {
                    *(uint *)((long)(local_118.
                                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vertices +
                             lVar49 + -0x30) = (uint)local_150 + (int)uVar46;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x28)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x28);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x20)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x20);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x18)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x18);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -8) =
                         *(undefined8 *)
                          ((long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 0x38;
                  } while (uVar46 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           0x6db6db6db6db6db7));
                  uVar21 = (uint)local_150 + (int)uVar46;
                }
                uVar43 = (ulong)uVar21;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < iVar16)) {
                  local_150 = CONCAT44(local_150._4_4_,uVar21);
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,6,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar21 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar21;
                  } while (uVar21 != (uint)local_148);
                  goto LAB_00595aeb;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ = 0;
              anon_unknown_19::convertPrimitiveToBaseType
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         (vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                          *)&local_168);
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              pTVar25 = (TriangleAdjacency *)local_f8.m_numberOfVertexOutputs;
              uVar43 = local_150;
              if ((TriangleAdjacency *)local_f8.m_numberOfVertexOutputs ==
                  (TriangleAdjacency *)
                  CONCAT44(local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_)) {
                uVar43 = local_150 & 0xffffffff;
              }
              else {
                do {
                  iVar16 = (int)uVar43;
                  uVar43 = (ulong)(iVar16 + 1);
                  pTVar25->v0->primitiveID = iVar16;
                  pTVar25->v1->primitiveID = iVar16;
                  pTVar25->v2->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v4;
                } while (pTVar25 !=
                         (TriangleAdjacency *)
                         CONCAT44(local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
              }
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        (pRVar12,pRVar35,pPVar22,
                         (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              break;
            case PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY:
              pRVar12 = (RenderState *)pVVar44->m_numberOfVertexOutputs;
              pRVar35 = (RenderTarget *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pPVar22 = (Program *)
                        (pVVar44->m_allocations).
                        super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              local_148 = (RenderTarget *)
                          local_90.
                          super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              sVar27 = 0;
              if (5 < uVar21) {
                sVar27 = (long)(int)uVar21 - 4U >> 1;
              }
              std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
              vector((vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                      *)&local_168,sVar27,(allocator_type *)&local_f8);
              pa::TriangleStripAdjacency::
              exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
                        ((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                          )local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start,(VertexPacket **)local_148,
                         (long)(int)uVar21,pRVar12->provokingVertexConvention);
              pGVar8 = pPVar22->geometryShader;
              if (pGVar8 != (GeometryShader *)0x0) {
                VertexPacketAllocator::VertexPacketAllocator
                          (&local_f8,
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pGVar8->m_outputs).
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
                GeometryEmitter::GeometryEmitter
                          (&local_c0,&local_f8,pPVar22->geometryShader->m_numVerticesOut);
                std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                          (&local_118,
                           ((long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x6db6db6db6db6db7,(allocator_type *)&local_138);
                iVar16 = (int)pPVar22->geometryShader->m_numInvocations;
                local_148 = (RenderTarget *)CONCAT44(local_148._4_4_,iVar16);
                uVar21 = (uint)local_150;
                if (local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar49 = 0x28;
                  uVar46 = 0;
                  do {
                    *(uint *)((long)(local_118.
                                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vertices +
                             lVar49 + -0x30) = (uint)local_150 + (int)uVar46;
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x28)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x28);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x20)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x20);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x18)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x18);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -0x10)
                         = *(undefined8 *)
                            ((long)local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar49 + -0x10);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49 + -8) =
                         *(undefined8 *)
                          ((long)local_168.
                                 super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
                    *(undefined8 *)
                     ((long)(local_118.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar49) =
                         *(undefined8 *)
                          ((long)&(local_168.
                                   super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->v0 + lVar49);
                    uVar46 = uVar46 + 1;
                    lVar49 = lVar49 + 0x38;
                  } while (uVar46 < (ulong)(((long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_168.
                                                                                                      
                                                  super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           0x6db6db6db6db6db7));
                  uVar21 = (uint)local_150 + (int)uVar46;
                }
                uVar43 = (ulong)uVar21;
                if ((local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
                     local_118.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_finish) && (0 < iVar16)) {
                  local_150 = CONCAT44(local_150._4_4_,uVar21);
                  uVar46 = 0;
                  do {
                    (**pPVar22->geometryShader->_vptr_GeometryShader)
                              (pPVar22->geometryShader,&local_c0,6,
                               local_118.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (ulong)(uint)((int)((ulong)((long)local_118.
                                                                                                                                  
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_118.
                                                                                                                
                                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                            -0x49249249),uVar46);
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_138.
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    GeometryEmitter::moveEmittedTo(&local_c0,&local_138);
                    ppVVar41 = local_138.
                               super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_138.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar37 = (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar43 = 0;
                      ppVVar28 = local_138.
                                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        uVar31 = uVar43 + 1;
                        if (ppVVar41[uVar43] != (VertexPacket *)0x0) {
                          if (uVar31 < uVar37) {
                            uVar31 = uVar37;
                          }
                          ppVVar1 = ppVVar41 + uVar43;
                          uVar37 = uVar43;
                          do {
                            uVar36 = uVar37;
                            uVar37 = uVar31;
                            uVar50 = uVar31 - 1;
                            if (uVar31 - 1 == uVar36) break;
                            uVar37 = uVar36 + 1;
                            uVar50 = uVar36;
                          } while (ppVVar41[uVar36 + 1] != (VertexPacket *)0x0);
                          GVar6 = pPVar22->geometryShader->m_outputType;
                          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
                            anon_unknown_19::
                            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                                      (pRVar12,pRVar35,pPVar22,ppVVar1,uVar37 - uVar43,&local_f8);
                          }
                          ppVVar28 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          uVar31 = uVar50 + 2;
                          ppVVar41 = local_138.
                                     super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar43 = uVar31;
                        uVar37 = (long)ppVVar28 - (long)ppVVar41 >> 3;
                      } while (uVar43 < uVar37);
                    }
                    if (ppVVar41 != (pointer)0x0) {
                      operator_delete(ppVVar41,(long)local_138.
                                                                                                          
                                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               - (long)ppVVar41);
                    }
                    uVar21 = (int)uVar46 + 1;
                    uVar46 = (ulong)uVar21;
                  } while (uVar21 != (uint)local_148);
                  goto LAB_00595aeb;
                }
                goto LAB_00595af5;
              }
              local_f8.m_numberOfVertexOutputs = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              local_f8.m_allocations.
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ = 0;
              anon_unknown_19::convertPrimitiveToBaseType
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         (vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                          *)&local_168);
              (anonymous_namespace)::
              makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              pTVar25 = (TriangleAdjacency *)local_f8.m_numberOfVertexOutputs;
              uVar43 = local_150;
              if ((TriangleAdjacency *)local_f8.m_numberOfVertexOutputs ==
                  (TriangleAdjacency *)
                  CONCAT44(local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.m_allocations.
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_)) {
                uVar43 = local_150 & 0xffffffff;
              }
              else {
                do {
                  iVar16 = (int)uVar43;
                  uVar43 = (ulong)(iVar16 + 1);
                  pTVar25->v0->primitiveID = iVar16;
                  pTVar25->v1->primitiveID = iVar16;
                  pTVar25->v2->primitiveID = iVar16;
                  pTVar25 = (TriangleAdjacency *)&pTVar25->v4;
                } while (pTVar25 !=
                         (TriangleAdjacency *)
                         CONCAT44(local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_f8.m_allocations.
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_));
              }
              (anonymous_namespace)::
              drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                        (pRVar12,pRVar35,pPVar22,
                         (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&local_f8,
                         &local_68);
              break;
            default:
              goto switchD_00593783_default;
            }
            if ((TriangleAdjacency *)local_f8.m_numberOfVertexOutputs != (TriangleAdjacency *)0x0) {
              operator_delete((void *)local_f8.m_numberOfVertexOutputs,
                              CONCAT44(local_f8.m_allocations.
                                       super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       local_f8.m_allocations.
                                       super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                              local_f8.m_numberOfVertexOutputs);
            }
LAB_00595cc3:
            pVVar44 = local_100;
            if ((TriangleAdjacency *)
                local_168.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
                super__Vector_impl_data._M_start != (TriangleAdjacency *)0x0) {
              operator_delete(local_168.
                              super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_168.
                                    super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168.
                                    super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              pVVar44 = local_100;
            }
          }
LAB_00595cde:
          elementNdx = elementNdx + 1;
          this_00 = (PrimitiveList *)
                    (pVVar44->m_singleAllocPool).
                    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar46 = this_00->m_numElements;
          uVar43 = uVar43 & 0xffffffff;
        } while (elementNdx < uVar46);
      }
      uVar21 = (int)local_78 + 1;
      local_78 = (ulong)uVar21;
    } while (uVar21 != local_6c);
    if ((RenderTarget *)
        local_90.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl
        .super__Vector_impl_data._M_start != (RenderTarget *)0x0) {
      operator_delete(local_90.
                      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    VertexPacketAllocator::~VertexPacketAllocator(&local_68);
  }
  return;
}

Assistant:

void Renderer::drawInstanced (const DrawCommand& command, int numInstances) const
{
	// Do not run bad commands
	{
		const bool validCommand = isValidCommand(command, numInstances);
		if (!validCommand)
		{
			DE_ASSERT(false);
			return;
		}
	}

	// Do not draw if nothing to draw
	{
		if (command.primitives.getNumElements() == 0 || numInstances == 0)
			return;
	}

	// Prepare transformation

	const size_t				numVaryings = command.program.vertexShader->getOutputs().size();
	VertexPacketAllocator		vpalloc(numVaryings);
	std::vector<VertexPacket*>	vertexPackets = vpalloc.allocArray(command.primitives.getNumElements());
	DrawContext					drawContext;

	for (int instanceID = 0; instanceID < numInstances; ++instanceID)
	{
		// Each instance has its own primitives
		drawContext.primitiveID = 0;

		for (size_t elementNdx = 0; elementNdx < command.primitives.getNumElements(); ++elementNdx)
		{
			int numVertexPackets = 0;

			// collect primitive vertices until restart

			while (elementNdx < command.primitives.getNumElements() &&
					!(command.state.restart.enabled && command.primitives.isRestartIndex(elementNdx, command.state.restart.restartIndex)))
			{
				// input
				vertexPackets[numVertexPackets]->instanceNdx	= instanceID;
				vertexPackets[numVertexPackets]->vertexNdx		= (int)command.primitives.getIndex(elementNdx);

				// output
				vertexPackets[numVertexPackets]->pointSize		= command.state.point.pointSize;	// default value from the current state
				vertexPackets[numVertexPackets]->position		= tcu::Vec4(0, 0, 0, 0);			// no undefined values

				++numVertexPackets;
				++elementNdx;
			}

			// Duplicated restart shade
			if (numVertexPackets == 0)
				continue;

			// \todo Vertex cache?

			// Transform vertices

			command.program.vertexShader->shadeVertices(command.vertexAttribs, &vertexPackets[0], numVertexPackets);

			// Draw primitives

			switch (command.primitives.getPrimitiveType())
			{
				case PRIMITIVETYPE_TRIANGLES:				{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLES>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_STRIP:			{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP>			(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_FAN:			{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_FAN>				(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINES:					{ drawAsPrimitives<PRIMITIVETYPE_LINES>						(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_STRIP:				{ drawAsPrimitives<PRIMITIVETYPE_LINE_STRIP>				(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_LOOP:				{ drawAsPrimitives<PRIMITIVETYPE_LINE_LOOP>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_POINTS:					{ drawAsPrimitives<PRIMITIVETYPE_POINTS>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINES_ADJACENCY:			{ drawAsPrimitives<PRIMITIVETYPE_LINES_ADJACENCY>			(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_STRIP_ADJACENCY:	{ drawAsPrimitives<PRIMITIVETYPE_LINE_STRIP_ADJACENCY>		(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLES_ADJACENCY:		{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLES_ADJACENCY>		(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY:{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY>	(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				default:
					DE_ASSERT(DE_FALSE);
			}
		}
	}
}